

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_39dd::readCompare
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *values,roaring64_bitmap_t *r,
               uint64_t step)

{
  _Bool _Var1;
  roaring64_iterator_t *prVar2;
  uint64_t a;
  ulong uVar3;
  ulong b;
  uint64_t uVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  allocator_type local_61;
  roaring64_iterator_t *local_60;
  ulong local_58;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  value_type local_38;
  
  prVar2 = roaring64_iterator_create((roaring64_bitmap_t *)r);
  local_38 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50,
             (long)(values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_38,&local_61);
  uVar3 = 0;
  local_60 = prVar2;
  while (prVar2 = local_60,
        uVar3 < (ulong)((long)(values->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(values->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 3)) {
    _Var1 = roaring64_iterator_has_value(local_60);
    _assert_true((ulong)_Var1,"roaring64_iterator_has_value(it)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                 ,0x6b8);
    a = roaring64_iterator_read(prVar2,local_50._M_impl.super__Vector_impl_data._M_start,step);
    b = ((long)(values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3) - uVar3;
    if (step <= b) {
      b = step;
    }
    _assert_int_equal(a,b,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                      ,0x6ba);
    local_58 = uVar3;
    for (uVar4 = 0; a != uVar4; uVar4 = uVar4 + 1) {
      _assert_int_equal((values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar3 + uVar4],
                        local_50._M_impl.super__Vector_impl_data._M_start[uVar4],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                        ,0x6bc);
    }
    uVar3 = local_58 + a;
  }
  _Var1 = roaring64_iterator_has_value(local_60);
  _assert_true((ulong)!_Var1,"roaring64_iterator_has_value(it)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x6c0);
  roaring64_iterator_free(prVar2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

void readCompare(const std::vector<uint64_t>& values,
                 const roaring64_bitmap_t* r, uint64_t step) {
    roaring64_iterator_t* it = roaring64_iterator_create(r);
    std::vector<uint64_t> buffer(values.size(), 0);
    uint64_t read = 0;
    while (read < values.size()) {
        assert_true(roaring64_iterator_has_value(it));
        uint64_t step_read = roaring64_iterator_read(it, buffer.data(), step);
        assert_int_equal(step_read, std::min(step, values.size() - read));
        for (size_t i = 0; i < step_read; ++i) {
            assert_int_equal(values[read + i], buffer[i]);
        }
        read += step_read;
    }
    assert_false(roaring64_iterator_has_value(it));
    roaring64_iterator_free(it);
}